

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

char * print_string_ptr(char *str,printbuffer *p)

{
  int iVar1;
  bool bVar2;
  byte bVar3;
  void *pvVar4;
  byte bVar5;
  byte *pbVar6;
  int iVar7;
  int iVar8;
  byte *pbVar9;
  char *pcVar10;
  
  if (str == (char *)0x0) {
    if (p == (printbuffer *)0x0) {
      pcVar10 = (char *)(*cJSON_malloc)(3);
    }
    else {
      pcVar10 = ensure(p,3);
    }
    if (pcVar10 != (char *)0x0) {
      pcVar10[2] = '\0';
      pcVar10[0] = '\"';
      pcVar10[1] = '\"';
      return pcVar10;
    }
  }
  else {
    bVar3 = *str;
    pcVar10 = str;
    if (bVar3 != 0) {
      bVar2 = false;
      bVar5 = bVar3;
      do {
        bVar2 = (bool)(bVar2 | ((bVar5 == 0x5c || bVar5 == 0x22) || bVar5 < 0x20));
        bVar5 = pcVar10[1];
        pcVar10 = pcVar10 + 1;
      } while (bVar5 != 0);
      if (bVar2) {
        if (bVar3 == 0) {
          iVar8 = 3;
        }
        else {
          pbVar9 = (byte *)(str + 1);
          iVar8 = 0;
          do {
            if (iVar8 + 1 == 0) {
              iVar8 = 0;
              break;
            }
            pvVar4 = memchr("\"\\\b\f\n\r\t",(uint)bVar3,8);
            iVar1 = iVar8 + 2;
            iVar7 = iVar8 + 1;
            if (bVar3 < 0x20) {
              iVar7 = iVar8 + 6;
            }
            iVar8 = iVar7;
            if (pvVar4 != (void *)0x0) {
              iVar8 = iVar1;
            }
            bVar3 = *pbVar9;
            pbVar9 = pbVar9 + 1;
          } while (bVar3 != 0);
          iVar8 = iVar8 + 3;
        }
        if (p == (printbuffer *)0x0) {
          pcVar10 = (char *)(*cJSON_malloc)((long)iVar8);
        }
        else {
          pcVar10 = ensure(p,iVar8);
        }
        if (pcVar10 == (char *)0x0) {
          return (char *)0x0;
        }
        pbVar9 = (byte *)(pcVar10 + 1);
        *pcVar10 = '\"';
        bVar3 = *str;
        if (bVar3 != 0) {
          pbVar6 = (byte *)(str + 1);
          do {
            if (((bVar3 < 0x20) || (bVar3 == 0x22)) || (bVar3 == 0x5c)) {
              *pbVar9 = 0x5c;
              bVar3 = pbVar6[-1];
              switch(bVar3) {
              case 8:
                pbVar9[1] = 0x62;
                break;
              case 9:
                pbVar9[1] = 0x74;
                break;
              case 10:
                pbVar9[1] = 0x6e;
                break;
              case 0xb:
switchD_00104c93_caseD_b:
                sprintf((char *)(pbVar9 + 1),"u%04x");
                pbVar9 = pbVar9 + 6;
                goto LAB_00104cf7;
              case 0xc:
                pbVar9[1] = 0x66;
                break;
              case 0xd:
                pbVar9[1] = 0x72;
                break;
              default:
                if (bVar3 == 0x22) {
                  pbVar9[1] = 0x22;
                }
                else {
                  if (bVar3 != 0x5c) goto switchD_00104c93_caseD_b;
                  pbVar9[1] = 0x5c;
                }
              }
              pbVar9 = pbVar9 + 2;
            }
            else {
              *pbVar9 = bVar3;
              pbVar9 = pbVar9 + 1;
            }
LAB_00104cf7:
            bVar3 = *pbVar6;
            pbVar6 = pbVar6 + 1;
          } while (bVar3 != 0);
        }
        pbVar9[0] = 0x22;
        pbVar9[1] = 0;
        return pcVar10;
      }
    }
    iVar8 = (int)pcVar10 - (int)str;
    if (p == (printbuffer *)0x0) {
      pcVar10 = (char *)(*cJSON_malloc)((long)(iVar8 + 3));
    }
    else {
      pcVar10 = ensure(p,iVar8 + 3);
    }
    if (pcVar10 != (char *)0x0) {
      *pcVar10 = '\"';
      strcpy(pcVar10 + 1,str);
      pcVar10[(long)iVar8 + 1] = '\"';
      pcVar10[(long)(iVar8 + 1) + 1] = '\0';
      return pcVar10;
    }
  }
  return (char *)0x0;
}

Assistant:

static char *print_string_ptr(const char *str,printbuffer *p)
{
	const char *ptr;char *ptr2,*out;int len=0,flag=0;unsigned char token;

	if (!str)
	{
		if (p)	out=ensure(p,3);
		else	out=(char*)cJSON_malloc(3);
		if (!out) return 0;
		strcpy(out,"\"\"");
		return out;
	}
	
	for (ptr=str;*ptr;ptr++) flag|=((*ptr>0 && *ptr<32)||(*ptr=='\"')||(*ptr=='\\'))?1:0;
	if (!flag)
	{
		len=(int)(ptr-str);
		if (p) out=ensure(p,len+3);
		else		out=(char*)cJSON_malloc(len+3);
		if (!out) return 0;
		ptr2=out;*ptr2++='\"';
		strcpy(ptr2,str);
		ptr2[len]='\"';
		ptr2[len+1]=0;
		return out;
	}
	
	ptr=str;while ((token=*ptr) && ++len) {if (strchr("\"\\\b\f\n\r\t",token)) len++; else if (token<32) len+=5;ptr++;}
	
	if (p)	out=ensure(p,len+3);
	else	out=(char*)cJSON_malloc(len+3);
	if (!out) return 0;

	ptr2=out;ptr=str;
	*ptr2++='\"';
	while (*ptr)
	{
		if ((unsigned char)*ptr>31 && *ptr!='\"' && *ptr!='\\') *ptr2++=*ptr++;
		else
		{
			*ptr2++='\\';
			switch (token=*ptr++)
			{
				case '\\':	*ptr2++='\\';	break;
				case '\"':	*ptr2++='\"';	break;
				case '\b':	*ptr2++='b';	break;
				case '\f':	*ptr2++='f';	break;
				case '\n':	*ptr2++='n';	break;
				case '\r':	*ptr2++='r';	break;
				case '\t':	*ptr2++='t';	break;
				default: sprintf(ptr2,"u%04x",token);ptr2+=5;	break;	/* escape and print */
			}
		}
	}
	*ptr2++='\"';*ptr2++=0;
	return out;
}